

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O1

void * prepend_alloc(mstate m,char *newbase,char *oldbase,size_t nb)

{
  mchunkptr pmVar1;
  long *plVar2;
  malloc_tree_chunk *pmVar3;
  malloc_tree_chunk *pmVar4;
  tbinptr pmVar5;
  tbinptr pmVar6;
  byte bVar7;
  malloc_chunk *pmVar8;
  uint uVar9;
  malloc_tree_chunk **ppmVar10;
  malloc_chunk *pmVar11;
  uint uVar12;
  malloc_chunk *pmVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  tbinptr pmVar17;
  ulong uVar18;
  tbinptr pmVar19;
  
  uVar18 = (ulong)(-(int)newbase - 0x10U & 0xf);
  pmVar17 = (tbinptr)(oldbase + (-(int)oldbase - 0x10U & 0xf));
  pmVar1 = (mchunkptr)(newbase + nb + uVar18);
  uVar16 = (long)pmVar17 - (long)pmVar1;
  *(size_t *)(newbase + uVar18 + 8) = nb | 3;
  if (pmVar17 == (tbinptr)m->top) {
    uVar16 = uVar16 + m->topsize;
    m->topsize = uVar16;
    m->top = pmVar1;
    pmVar1->head = uVar16 | 1;
    goto LAB_00154c16;
  }
  if (pmVar17 == (tbinptr)m->dv) {
    uVar16 = uVar16 + m->dvsize;
    m->dvsize = uVar16;
    m->dv = pmVar1;
    pmVar1->head = uVar16 | 1;
    *(ulong *)((long)pmVar1 + uVar16) = uVar16;
    goto LAB_00154c16;
  }
  uVar14 = pmVar17->head;
  if (((uint)uVar14 & 3) == 1) {
    if (0xff < uVar14) {
      pmVar19 = pmVar17->bk;
      pmVar3 = pmVar17->child[2];
      if (pmVar19 == pmVar17) {
        pmVar19 = pmVar17->child[1];
        if (pmVar19 != (tbinptr)0x0) {
          ppmVar10 = pmVar17->child + 1;
LAB_001549d8:
          do {
            if (pmVar19->child[1] == (malloc_tree_chunk *)0x0) {
              if (pmVar19->child[0] == (malloc_tree_chunk *)0x0) goto code_r0x001549ec;
              ppmVar10 = pmVar19->child;
            }
            else {
              ppmVar10 = pmVar19->child + 1;
            }
            pmVar19 = *ppmVar10;
          } while( true );
        }
        pmVar19 = pmVar17->child[0];
        if (pmVar19 != (tbinptr)0x0) {
          ppmVar10 = pmVar17->child;
          goto LAB_001549d8;
        }
        pmVar19 = (tbinptr)0x0;
      }
      else {
        pmVar4 = pmVar17->fd;
        if (((pmVar4 < (malloc_tree_chunk *)m->least_addr) || (pmVar4->bk != pmVar17)) ||
           (pmVar19->fd != pmVar17)) goto LAB_00154c24;
        pmVar4->bk = pmVar19;
        pmVar19->fd = pmVar4;
      }
      goto LAB_001549fd;
    }
    pmVar3 = pmVar17->fd;
    pmVar4 = pmVar17->bk;
    if ((pmVar3 != (malloc_tree_chunk *)(m->smallbins + (uVar14 >> 3) * 2)) &&
       ((pmVar3 < (malloc_tree_chunk *)m->least_addr || (pmVar3->bk != pmVar17))))
    goto LAB_00154c24;
    if (pmVar4 == pmVar3) {
      bVar7 = (byte)(uVar14 >> 3) & 0x1f;
      m->smallmap = m->smallmap & (-2 << bVar7 | 0xfffffffeU >> 0x20 - bVar7);
    }
    else {
      if ((pmVar4 != (malloc_tree_chunk *)(m->smallbins + (uVar14 >> 3) * 2)) &&
         ((pmVar4 < (malloc_tree_chunk *)m->least_addr || (pmVar4->fd != pmVar17))))
      goto LAB_00154c24;
      pmVar3->bk = pmVar4;
      pmVar4->fd = pmVar3;
    }
    goto LAB_00154a92;
  }
  goto LAB_00154a9c;
code_r0x001549ec:
  if (ppmVar10 < m->least_addr) goto LAB_00154c24;
  *ppmVar10 = (malloc_tree_chunk *)0x0;
LAB_001549fd:
  if (pmVar3 != (malloc_tree_chunk *)0x0) {
    uVar9 = *(uint *)(pmVar17->child + 3);
    if (pmVar17 == m->treebins[uVar9]) {
      m->treebins[uVar9] = pmVar19;
      if (pmVar19 == (tbinptr)0x0) {
        bVar7 = (byte)uVar9 & 0x1f;
        m->treemap = m->treemap & (-2 << bVar7 | 0xfffffffeU >> 0x20 - bVar7);
        goto LAB_00154a47;
      }
    }
    else {
      if (pmVar3 < (malloc_tree_chunk *)m->least_addr) goto LAB_00154c24;
      if (pmVar3->child[0] == pmVar17) {
        pmVar3->child[0] = pmVar19;
      }
      else {
        pmVar3->child[1] = pmVar19;
      }
LAB_00154a47:
      if (pmVar19 == (tbinptr)0x0) goto LAB_00154a92;
    }
    pmVar5 = (tbinptr)m->least_addr;
    if (pmVar19 < pmVar5) goto LAB_00154c24;
    pmVar19->child[2] = pmVar3;
    pmVar6 = pmVar17->child[0];
    if (pmVar6 != (tbinptr)0x0) {
      if (pmVar6 < pmVar5) goto LAB_00154c24;
      pmVar19->child[0] = pmVar6;
      pmVar6->child[2] = pmVar19;
    }
    pmVar3 = pmVar17->child[1];
    if (pmVar3 != (malloc_tree_chunk *)0x0) {
      if (pmVar3 < (malloc_tree_chunk *)m->least_addr) goto LAB_00154c24;
      pmVar19->child[1] = pmVar3;
      pmVar3->parent = pmVar19;
    }
  }
LAB_00154a92:
  pmVar17 = (tbinptr)((long)pmVar17->child + ((uVar14 & 0xfffffffffffffff8) - 0x20));
  uVar16 = uVar16 + (uVar14 & 0xfffffffffffffff8);
LAB_00154a9c:
  *(byte *)&pmVar17->head = (byte)pmVar17->head & 0xfe;
  pmVar1->head = uVar16 | 1;
  *(ulong *)((long)&pmVar1->prev_foot + uVar16) = uVar16;
  if (uVar16 < 0x100) {
    pmVar11 = (malloc_chunk *)(m->smallbins + (uVar16 >> 3) * 2);
    uVar9 = (uint)(uVar16 >> 3);
    if ((m->smallmap >> (uVar9 & 0x1f) & 1) == 0) {
      m->smallmap = m->smallmap | 1 << (uVar9 & 0x1f);
      pmVar13 = pmVar11;
    }
    else {
      pmVar13 = pmVar11->fd;
      if (pmVar11->fd < (malloc_chunk *)m->least_addr) {
LAB_00154c24:
        abort();
      }
    }
    pmVar11->fd = pmVar1;
    pmVar13->bk = pmVar1;
    pmVar1->fd = pmVar13;
    pmVar1->bk = pmVar11;
  }
  else {
    uVar9 = (uint)(uVar16 >> 8);
    if (uVar9 == 0) {
      uVar12 = 0;
    }
    else {
      uVar12 = 0x1f;
      if (uVar9 < 0x10000) {
        uVar12 = ((uint)(uVar16 >> ((ulong)(byte)(0x26 - (char)LZCOUNT(uVar9)) & 0x3f)) & 1) +
                 LZCOUNT(uVar9) * 2 ^ 0x3e;
      }
    }
    pmVar11 = (malloc_chunk *)(m->treebins + uVar12);
    *(uint *)&pmVar1[1].bk = uVar12;
    pmVar1[1].prev_foot = 0;
    pmVar1[1].head = 0;
    if ((m->treemap >> (uVar12 & 0x1f) & 1) == 0) {
      m->treemap = m->treemap | 1 << (uVar12 & 0x1f);
      pmVar11->prev_foot = (size_t)pmVar1;
      pmVar1[1].fd = pmVar11;
      pmVar1->bk = pmVar1;
      pmVar1->fd = pmVar1;
    }
    else {
      pmVar11 = (malloc_chunk *)pmVar11->prev_foot;
      uVar14 = (ulong)(byte)(0x39 - (char)(uVar12 >> 1));
      if (uVar12 == 0x1f) {
        uVar14 = 0;
      }
      lVar15 = uVar16 << (uVar14 & 0x3f);
      do {
        if ((pmVar11->head & 0xfffffffffffffff8) == uVar16) {
          if ((pmVar11 < (malloc_chunk *)m->least_addr) ||
             (pmVar13 = pmVar11->fd, pmVar13 < (malloc_chunk *)m->least_addr)) goto LAB_00154c24;
          pmVar13->bk = pmVar1;
          pmVar11->fd = pmVar1;
          pmVar1->fd = pmVar13;
          pmVar1->bk = pmVar11;
          pmVar1[1].fd = (malloc_chunk *)0x0;
          break;
        }
        pmVar13 = *(malloc_chunk **)((long)pmVar11 + (lVar15 >> 0x3f) * -8 + 0x20);
        pmVar8 = pmVar13;
        if (pmVar13 == (malloc_chunk *)0x0) {
          plVar2 = (long *)((long)pmVar11 + (lVar15 >> 0x3f) * -8 + 0x20);
          if (plVar2 < m->least_addr) goto LAB_00154c24;
          *plVar2 = (long)pmVar1;
          pmVar1[1].fd = pmVar11;
          pmVar1->bk = pmVar1;
          pmVar1->fd = pmVar1;
          pmVar8 = pmVar11;
        }
        pmVar11 = pmVar8;
        lVar15 = lVar15 * 2;
      } while (pmVar13 != (malloc_chunk *)0x0);
    }
  }
LAB_00154c16:
  return newbase + uVar18 + 0x10;
}

Assistant:

static void* prepend_alloc(mstate m, char* newbase, char* oldbase,
                           size_t nb) {
  mchunkptr p = align_as_chunk(newbase);
  mchunkptr oldfirst = align_as_chunk(oldbase);
  size_t psize = (char*)oldfirst - (char*)p;
  mchunkptr q = chunk_plus_offset(p, nb);
  size_t qsize = psize - nb;
  set_size_and_pinuse_of_inuse_chunk(m, p, nb);

  assert((char*)oldfirst > (char*)q);
  assert(pinuse(oldfirst));
  assert(qsize >= MIN_CHUNK_SIZE);

  /* consolidate remainder with first chunk of old base */
  if (oldfirst == m->top) {
    size_t tsize = m->topsize += qsize;
    m->top = q;
    q->head = tsize | PINUSE_BIT;
    check_top_chunk(m, q);
  }
  else if (oldfirst == m->dv) {
    size_t dsize = m->dvsize += qsize;
    m->dv = q;
    set_size_and_pinuse_of_free_chunk(q, dsize);
  }
  else {
    if (!is_inuse(oldfirst)) {
      size_t nsize = chunksize(oldfirst);
      unlink_chunk(m, oldfirst, nsize);
      oldfirst = chunk_plus_offset(oldfirst, nsize);
      qsize += nsize;
    }
    set_free_with_pinuse(q, qsize, oldfirst);
    insert_chunk(m, q, qsize);
    check_free_chunk(m, q);
  }

  check_malloced_chunk(m, chunk2mem(p), nb);
  return chunk2mem(p);
}